

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O3

size_t __thiscall breakpoint_recorder::add_func(breakpoint_recorder *this,var *function)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  object_method *poVar3;
  undefined *puVar4;
  callable *this_00;
  type_info *ptVar5;
  function *pfVar6;
  _Node *p_Var7;
  runtime_error *prVar8;
  _Fwd_list_node_base *__to;
  string local_38;
  
  if (function->mDat == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar2 = (*function->mDat->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar4 + 8);
  if (pcVar1 == "N2cs13object_methodE") {
LAB_0012b244:
    poVar3 = cs_impl::any::const_val<cs::object_method>(function);
    cs_impl::any::operator=(function,&poVar3->callable);
  }
  else {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,"N2cs13object_methodE");
      if (iVar2 == 0) goto LAB_0012b244;
    }
    if (function->mDat == (proxy *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar2 = (*function->mDat->data->_vptr_baseHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar1 = *(char **)(puVar4 + 8);
    if (pcVar1 != "N2cs8callableE") {
      if (*pcVar1 == '*') {
LAB_0012b349:
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"Debugger just can break at specific line or function.","");
        cs::runtime_error::runtime_error(prVar8,&local_38);
        __cxa_throw(prVar8,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
      }
      iVar2 = strcmp(pcVar1,"N2cs8callableE");
      if (iVar2 != 0) goto LAB_0012b349;
    }
  }
  this_00 = cs_impl::any::const_val<cs::callable>(function);
  ptVar5 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           ::target_type(&this_00->mFunc);
  pcVar1 = *(char **)(ptVar5 + 8);
  if (pcVar1 != "N2cs8functionE") {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,"N2cs8functionE");
      if (iVar2 == 0) goto LAB_0012b2c0;
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Debugger can not break at CNI function.","");
    cs::runtime_error::runtime_error(prVar8,&local_38);
    __cxa_throw(prVar8,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
LAB_0012b2c0:
  pfVar6 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           ::target<cs::function>(&this_00->mFunc);
  pfVar6->mMatch = true;
  m_id = m_id + 1;
  p_Var7 = std::
           _Fwd_list_base<breakpoint_recorder::breakpoint,std::allocator<breakpoint_recorder::breakpoint>>
           ::_M_create_node<unsigned_long&,cs_impl::any&>
                     ((_Fwd_list_base<breakpoint_recorder::breakpoint,std::allocator<breakpoint_recorder::breakpoint>>
                       *)this,&m_id,function);
  (p_Var7->super__Fwd_list_node_base)._M_next =
       (this->m_breakpoints).
       super__Fwd_list_base<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
       ._M_impl._M_head._M_next;
  (this->m_breakpoints).
  super__Fwd_list_base<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
  ._M_impl._M_head._M_next = &p_Var7->super__Fwd_list_node_base;
  return m_id;
}

Assistant:

std::size_t add_func(cs::var function)
	{
		if (function.type() == typeid(cs::object_method))
			function = function.const_val<cs::object_method>().callable;
		else if (function.type() != typeid(cs::callable))
			throw cs::runtime_error("Debugger just can break at specific line or function.");
		const cs::callable::function_type &target = function.const_val<cs::callable>().get_raw_data();
		if (target.target_type() != typeid(cs::function))
			throw cs::runtime_error("Debugger can not break at CNI function.");
		target.target<cs::function>()->set_debugger_state(true);
		m_breakpoints.emplace_front(++m_id, function);
		return m_id;
	}